

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGNode::can_backtrace_to
          (CFGNode *this,CFGNode *parent,UnorderedSet<const_CFGNode_*> *node_cache)

{
  bool bVar1;
  size_type sVar2;
  reference ppCVar3;
  CFGNode *p;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *local_38;
  CFGNode *local_30;
  unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
  *local_28;
  UnorderedSet<const_CFGNode_*> *node_cache_local;
  CFGNode *parent_local;
  CFGNode *this_local;
  
  local_30 = this;
  local_28 = node_cache;
  node_cache_local = (UnorderedSet<const_CFGNode_*> *)parent;
  parent_local = this;
  sVar2 = std::
          unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
          ::count(node_cache,&local_30);
  if (sVar2 == 0) {
    local_38 = this;
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::insert(local_28,&local_38);
    __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&this->pred);
    p = (CFGNode *)
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                  (&this->pred);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&p), bVar1) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end1);
      if ((*ppCVar3 == (CFGNode *)node_cache_local) ||
         (bVar1 = can_backtrace_to(*ppCVar3,(CFGNode *)node_cache_local,local_28), bVar1)) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool CFGNode::can_backtrace_to(const CFGNode *parent, UnorderedSet<const CFGNode *> &node_cache) const
{
	if (node_cache.count(this))
		return false;
	node_cache.insert(this);

	for (auto *p : pred)
		if (p == parent || p->can_backtrace_to(parent, node_cache))
			return true;

	return false;
}